

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

char * coda_strprintf_abi_cxx11_(char *fmt,...)

{
  long lVar1;
  char *pcVar2;
  allocator *paVar3;
  string *this;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char **__s;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_8130;
  char *local_8128;
  allocator *local_8120;
  string *local_8118;
  char *local_8110;
  undefined1 local_8108 [16];
  undefined8 local_80f8;
  undefined8 local_80f0;
  undefined8 local_80e8;
  undefined8 local_80e0;
  undefined8 local_80d8;
  undefined8 local_80c8;
  undefined8 local_80b8;
  undefined8 local_80a8;
  undefined8 local_8098;
  undefined8 local_8088;
  undefined8 local_8078;
  undefined8 local_8068;
  char local_8058 [32787];
  allocator local_45;
  int local_44;
  char *pcStack_40;
  int bytes;
  char *BUF;
  va_list ap;
  char *fmt_local;
  
  __s = &local_8128;
  if (in_AL != '\0') {
    local_80d8 = in_XMM0_Qa;
    local_80c8 = in_XMM1_Qa;
    local_80b8 = in_XMM2_Qa;
    local_80a8 = in_XMM3_Qa;
    local_8098 = in_XMM4_Qa;
    local_8088 = in_XMM5_Qa;
    local_8078 = in_XMM6_Qa;
    local_8068 = in_XMM7_Qa;
  }
  pcStack_40 = local_8058;
  ap[0].overflow_arg_area = local_8108;
  ap[0]._0_8_ = &stack0x00000008;
  BUF._4_4_ = 0x30;
  BUF._0_4_ = 0x10;
  uStack_8130 = 0x10f3b1;
  local_8118 = (string *)fmt;
  local_8110 = fmt;
  local_80f8 = in_RDX;
  local_80f0 = in_RCX;
  local_80e8 = in_R8;
  local_80e0 = in_R9;
  local_44 = vsnprintf(pcStack_40,0x8000,in_RSI,&BUF);
  if (0x7fff < local_44) {
    lVar1 = -((long)local_44 + 0x10U & 0xfffffffffffffff0);
    __s = (char **)((long)&local_8128 + lVar1);
    ap[0].overflow_arg_area = local_8108;
    ap[0]._0_8_ = &stack0x00000008;
    BUF._4_4_ = 0x30;
    BUF._0_4_ = 0x10;
    *(undefined8 *)((long)&uStack_8130 + lVar1) = 0x10f419;
    pcStack_40 = (char *)__s;
    vsnprintf((char *)__s,(long)(local_44 + 1),in_RSI,&BUF);
  }
  local_8128 = pcStack_40;
  local_8120 = &local_45;
  *(char *)((long)__s + -8) = '8';
  *(char *)((long)__s + -7) = -0xc;
  *(char *)((long)__s + -6) = '\x10';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  std::allocator<char>::allocator();
  this = local_8118;
  paVar3 = local_8120;
  pcVar2 = local_8128;
  *(char *)((long)__s + -8) = 'R';
  *(char *)((long)__s + -7) = -0xc;
  *(char *)((long)__s + -6) = '\x10';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  std::__cxx11::string::string(this,pcVar2,paVar3);
  *(char *)((long)__s + -8) = ']';
  *(char *)((long)__s + -7) = -0xc;
  *(char *)((long)__s + -6) = '\x10';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  std::allocator<char>::~allocator((allocator<char> *)&local_45);
  return local_8110;
}

Assistant:

std::string coda_strprintf(const char *fmt, ...)
{
	va_list ap;

	char *BUF = (char *) alloca(BUFSZ);
	va_start(ap, fmt);
	int bytes = vsnprintf(BUF, BUFSZ, fmt, ap);
	va_end(ap);

	if (BUFSZ <= bytes)
	{
		BUF = (char *) alloca(bytes + 1);
		va_start(ap, fmt);
		vsnprintf(BUF, bytes + 1, fmt, ap);
		va_end(ap);
	}

	return BUF;
}